

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_VRR_Writer::WriteVRRFile(OSTEI_VRR_Writer *this,ostream *os,ostream *osh)

{
  _Rb_tree_node_base *p_Var1;
  OSTEI_GeneratorInfo *pOVar2;
  pointer pcVar3;
  OSTEI_VRR_Algorithm_Base *pOVar4;
  RRStepType RVar5;
  int iVar6;
  ostream *poVar7;
  const_iterator cVar8;
  undefined8 uVar9;
  QAM *tam;
  pointer tam_00;
  OSTEI_VRR_Writer *this_00;
  long lVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  QAM am;
  string stepchar;
  stringstream prototype;
  undefined8 local_568;
  undefined8 uStack_560;
  _Alloc_hider local_558;
  size_type local_550;
  char local_548 [24];
  undefined1 local_530 [8];
  OSTEI_VRR_Algorithm_Base *local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520 [2];
  undefined1 local_500 [36];
  RRStepType local_4dc;
  undefined1 local_4d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Rb_tree_node_base *local_4b8;
  size_t local_4b0;
  _Rb_tree_node_base local_4a8;
  _Rb_tree_node_base local_488;
  _Rb_tree_node_base local_468;
  _Rb_tree_node_base local_448;
  _Rb_tree_node_base local_428;
  _Rb_tree_node_base local_408;
  undefined1 local_3e8 [24];
  QAMList local_3d0;
  string local_3b8;
  char *local_398;
  size_type sStack_390;
  _Alloc_hider local_388;
  char local_378 [16];
  char *local_368;
  size_type sStack_360;
  _Alloc_hider local_358;
  char local_348 [16];
  char *local_338;
  size_type sStack_330;
  _Alloc_hider local_328;
  char local_318 [16];
  char *local_308;
  size_type sStack_300;
  _Alloc_hider local_2f8;
  _Base_ptr local_2e8 [2];
  char *local_2d8;
  size_type sStack_2d0;
  _Alloc_hider local_2c8;
  char local_2b8 [16];
  char *local_2a8;
  size_type sStack_2a0;
  _Alloc_hider local_298;
  char local_288 [16];
  char *local_278;
  size_type sStack_270;
  _Alloc_hider local_268;
  char local_258 [16];
  char *local_248;
  size_type sStack_240;
  _Alloc_hider local_238;
  char local_228 [16];
  char *local_218;
  size_type sStack_210;
  _Alloc_hider local_208;
  char local_1f8 [16];
  char *local_1e8;
  size_type sStack_1e0;
  _Alloc_hider local_1d8;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pOVar2 = this->info_;
  local_568 = *(char **)(pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems;
  uStack_560 = *(size_type *)((pOVar2->super_GeneratorInfoBase).finalam_.qam._M_elems + 2);
  local_558._M_p = local_548;
  pcVar3 = (pOVar2->super_GeneratorInfoBase).finalam_.tag._M_dataplus._M_p;
  local_3e8._16_8_ = osh;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_558,pcVar3,
             pcVar3 + (pOVar2->super_GeneratorInfoBase).finalam_.tag._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"//////////////////////////////////////////////\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>(os,"// VRR: ( ",10);
  local_1b8[0] = *(stringstream *)
                  ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (int)local_568);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  local_1b8[0] = *(stringstream *)
                  ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_568._4_4_)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," | ",3);
  local_1b8[0] = *(stringstream *)
                  ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + (int)uStack_560)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  local_1b8[0] = *(stringstream *)
                  ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + uStack_560._4_4_
                  );
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," )\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"//////////////////////////////////////////////\n",0x2f);
  pOVar4 = this->vrr_algo_;
  local_1e8 = local_568;
  sStack_1e0 = uStack_560;
  local_1d8._M_p = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_558._M_p,local_558._M_p + local_550);
  RVar5 = OSTEI_VRR_Algorithm_Base::GetRRStep(pOVar4,(QAM *)&local_1e8);
  if (local_1d8._M_p != local_1c8) {
    operator_delete(local_1d8._M_p);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  RRStepTypeToStr_abi_cxx11_(&local_3b8,RVar5);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"void VRR_",9);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_3b8._M_dataplus._M_p,local_3b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_4d8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[(int)local_568];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_4d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_4d8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[local_568._4_4_];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_4d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_4d8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[(int)uStack_560];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_4d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_4d8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[uStack_560._4_4_];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_4d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(\n",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,indent3_abi_cxx11_._M_dataplus._M_p,
                      indent3_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"SIMINT_DBLTYPE * const restrict ",0x20)
  ;
  local_4d8._8_8_ = 4;
  local_4c8._M_allocated_capacity._0_5_ = 0x4d495250;
  local_4d8._0_8_ = local_4d8 + 0x10;
  ArrVarName((string *)local_530,(QAM *)&local_568,(string *)local_4d8);
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_530,(long)local_528);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
  if (local_530 != (undefined1  [8])local_520) {
    operator_delete((void *)local_530);
  }
  pOVar4 = this->vrr_algo_;
  local_218 = local_568;
  sStack_210 = uStack_560;
  local_208._M_p = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_558._M_p,local_558._M_p + local_550);
  OSTEI_VRR_Algorithm_Base::GetAMReq((QAMList *)local_500,pOVar4,(QAM *)&local_218);
  local_4dc = RVar5;
  if (local_208._M_p != local_1f8) {
    operator_delete(local_208._M_p);
  }
  uVar9 = local_500._8_8_;
  if (local_500._0_8_ != local_500._8_8_) {
    tam = (QAM *)local_500._0_8_;
    do {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,indent3_abi_cxx11_._M_dataplus._M_p,
                          indent3_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"const SIMINT_DBLTYPE * const restrict ",0x26);
      local_4d8._8_8_ = 4;
      local_4c8._M_allocated_capacity._0_5_ = 0x4d495250;
      local_4d8._0_8_ = local_4d8 + 0x10;
      ArrVarName((string *)local_530,tam,(string *)local_4d8);
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_530,(long)local_528);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
      if (local_530 != (undefined1  [8])local_520) {
        operator_delete((void *)local_530);
      }
      tam = tam + 1;
    } while (tam != (QAM *)uVar9);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector((vector<QAM,_std::allocator<QAM>_> *)local_500);
  pOVar4 = this->vrr_algo_;
  local_248 = local_568;
  sStack_240 = uStack_560;
  local_238._M_p = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_558._M_p,local_558._M_p + local_550);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_((StringSet *)local_530,pOVar4,(QAM *)&local_248);
  if (local_238._M_p != local_228) {
    operator_delete(local_238._M_p);
  }
  uVar9 = local_520[0]._8_8_;
  if ((_Rb_tree_node_base *)local_520[0]._8_8_ != (_Rb_tree_node_base *)&local_528) {
    do {
      if ((IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_),
         iVar6 != 0)) {
        local_4d8._0_8_ = local_4d8 + 0x10;
        local_4d8._8_8_ = 4;
        local_4c8._M_allocated_capacity._0_5_ = 0x41505f50;
        local_4b8 = &local_4a8;
        local_4a8._M_color = 0x42505f50;
        local_4b0 = 4;
        local_4a8._4_1_ = 0;
        local_4a8._M_left = &local_488;
        local_488._M_color = 0x41505f51;
        local_4a8._M_right = (_Base_ptr)0x4;
        local_488._4_1_ = 0;
        local_488._M_left = &local_468;
        local_468._M_color = 0x42505f51;
        local_488._M_right = (_Base_ptr)0x4;
        local_468._4_1_ = 0;
        local_468._M_left = &local_448;
        local_448._M_color._0_2_ = 0x5150;
        local_468._M_right = (_Base_ptr)0x2;
        local_448._M_color._2_1_ = _S_red >> 0x10;
        local_448._M_left = &local_428;
        local_428._M_color = 0x7a797850;
        local_448._M_right = (_Base_ptr)0x4;
        local_428._4_1_ = 0;
        local_428._M_left = &local_408;
        local_408._4_2_ = 0x5150;
        local_408._M_color = 0x5f706f61;
        local_428._M_right = (_Base_ptr)0x6;
        local_408._6_1_ = 0;
        local_408._M_left = (_Base_ptr)local_3e8;
        local_3e8._4_2_ = 0x5150;
        local_3e8._0_4_ = 0x5f716f61;
        local_408._M_right = (_Base_ptr)0x6;
        local_3e8[6] = 0;
        __l._M_len = 8;
        __l._M_array = (iterator)local_4d8;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_500,(allocator_type *)&local_3d0);
        lVar10 = 0;
        do {
          if (local_3e8 + lVar10 != *(undefined1 **)(local_3e8 + lVar10 + -0x10)) {
            operator_delete(*(undefined1 **)(local_3e8 + lVar10 + -0x10));
          }
          lVar10 = lVar10 + -0x20;
        } while (lVar10 != -0x100);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_,&__dso_handle
                    );
        __cxa_guard_release(&IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_);
      }
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_,
                     (key_type *)(uVar9 + 0x20));
      if (cVar8._M_node ==
          (_Base_ptr)(IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_ + 8)) {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,indent3_abi_cxx11_._M_dataplus._M_p,
                            indent3_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"const SIMINT_DBLTYPE ",0x15);
      }
      else {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,indent3_abi_cxx11_._M_dataplus._M_p,
                            indent3_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"const SIMINT_DBLTYPE * ",0x17);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)(uVar9 + 0x20),
                          (long)((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
      uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9);
    } while ((_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)&local_528);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_530);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,indent3_abi_cxx11_._M_dataplus._M_p,
                      indent3_abi_cxx11_._M_string_length);
  RVar5 = local_4dc;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"const int num_n)",0x10);
  std::__cxx11::stringbuf::str();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(char *)local_4d8._0_8_,local_4d8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
  if (uStack_560._4_4_ == 0 && local_568._4_4_ == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"    int n = 0;\n",0xf);
    pOVar4 = this->vrr_algo_;
    local_278 = local_568;
    sStack_270 = uStack_560;
    local_268._M_p = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_558._M_p,local_558._M_p + local_550);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2p((IntSet *)local_4d8,pOVar4,(QAM *)&local_278);
    if (local_268._M_p != local_258) {
      operator_delete(local_268._M_p);
    }
    p_Var1 = (_Rb_tree_node_base *)(local_4d8 + 8);
    for (uVar9 = local_4c8._8_8_; (_Rb_tree_node_base *)uVar9 != p_Var1;
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar7,((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"_over_2p = SIMINT_MUL(SIMINT_DBLSET1(",0x25);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar7,((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"), one_over_2p);\n",0x11);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_4d8);
    pOVar4 = this->vrr_algo_;
    local_2a8 = local_568;
    sStack_2a0 = uStack_560;
    local_298._M_p = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_558._M_p,local_558._M_p + local_550);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2q((IntSet *)local_4d8,pOVar4,(QAM *)&local_2a8);
    uVar9 = local_4c8._8_8_;
    if (local_298._M_p != local_288) {
      operator_delete(local_298._M_p);
      uVar9 = local_4c8._8_8_;
    }
    for (; (_Rb_tree_node_base *)uVar9 != p_Var1;
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar7,((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"_over_2q = SIMINT_MUL(SIMINT_DBLSET1(",0x25);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar7,((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"), one_over_2q);\n",0x11);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_4d8);
    pOVar4 = this->vrr_algo_;
    local_2d8 = local_568;
    sStack_2d0 = uStack_560;
    local_2c8._M_p = local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2c8,local_558._M_p,local_558._M_p + local_550);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2pq((IntSet *)local_4d8,pOVar4,(QAM *)&local_2d8);
    uVar9 = local_4c8._8_8_;
    if (local_2c8._M_p != local_2b8) {
      operator_delete(local_2c8._M_p);
      uVar9 = local_4c8._8_8_;
    }
    for (; (_Rb_tree_node_base *)uVar9 != p_Var1;
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"const SIMINT_DBLTYPE vrr_const_",0x1f);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar7,((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"_over_2pq = SIMINT_MUL(SIMINT_DBLSET1(",0x26);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar7,((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"), one_over_2pq);\n",0x12);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_4d8);
    local_308 = local_568;
    sStack_300 = uStack_560;
    local_2f8._M_p = (pointer)local_2e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,local_558._M_p,local_558._M_p + local_550);
    pOVar4 = this->vrr_algo_;
    local_338 = local_568;
    sStack_330 = uStack_560;
    local_328._M_p = local_318;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,local_558._M_p,local_558._M_p + local_550);
    OSTEI_VRR_Algorithm_Base::GetSteps((VRR_StepSet *)local_4d8,pOVar4,(QAM *)&local_338);
    this_00 = (OSTEI_VRR_Writer *)local_530;
    local_530 = (undefined1  [8])local_520;
    std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"num_n","");
    WriteVRRSteps_(this_00,os,(QAM *)&local_308,(VRR_StepSet *)local_4d8,(string *)local_530);
    if (local_530 != (undefined1  [8])local_520) {
      operator_delete((void *)local_530);
    }
    std::
    _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
    ::~_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                 *)local_4d8);
    if (local_328._M_p != local_318) {
      operator_delete(local_328._M_p);
    }
    uVar9 = local_2f8._M_p;
    if ((_Base_ptr *)local_2f8._M_p == local_2e8) goto LAB_0011d5cb;
  }
  else {
    local_4d8._0_8_ = local_568;
    local_4d8._8_8_ = uStack_560;
    local_4c8._M_allocated_capacity = (size_type)&local_4b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_4d8 + 0x10),local_558._M_p,local_558._M_p + local_550);
    if ((int)local_568 == 0) {
      local_4d8._0_8_ = CONCAT44((int)local_4d8._0_8_,SUB84(local_4d8._0_8_,4));
    }
    if ((int)uStack_560 == 0) {
      local_4d8._8_8_ = CONCAT44((int)local_4d8._8_8_,SUB84(local_4d8._8_8_,4));
    }
    if ((RVar5 == J) || (RVar5 == L)) {
      std::__cxx11::string::_M_replace_aux((ulong)&local_3b8,0,local_3b8._M_string_length,'\x01');
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"// Routines are identical except for swapping of\n",0x31);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"// PA with PB and QC with QD\n",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"VRR_",4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_3b8._M_dataplus._M_p,local_3b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
    local_530[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                   [(int)local_4d8._0_4_];
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_530,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
    local_530[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                   [(int)local_4d8._4_4_];
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_530,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
    local_530[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                   [(int)local_4d8._8_4_];
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_530,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
    local_530[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                   [(int)local_4d8._12_4_];
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_530,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(\n",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
    local_520[0]._M_allocated_capacity._0_4_ = 0x4d495250;
    local_528 = (OSTEI_VRR_Algorithm_Base *)0x4;
    local_520[0]._M_local_buf[4] = '\0';
    local_530 = (undefined1  [8])local_520;
    ArrVarName((string *)local_500,(QAM *)&local_568,(string *)local_530);
    if (local_530 != (undefined1  [8])local_520) {
      operator_delete((void *)local_530);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_500._0_8_,local_500._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
    if ((QAM *)local_500._0_8_ != (QAM *)(local_500 + 0x10)) {
      operator_delete((void *)local_500._0_8_);
    }
    pOVar4 = this->vrr_algo_;
    local_368 = local_568;
    sStack_360 = uStack_560;
    local_358._M_p = local_348;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,local_558._M_p,local_558._M_p + local_550);
    OSTEI_VRR_Algorithm_Base::GetAMReq(&local_3d0,pOVar4,(QAM *)&local_368);
    if (local_358._M_p != local_348) {
      operator_delete(local_358._M_p);
    }
    if (local_3d0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_3d0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      tam_00 = local_3d0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,indent3_abi_cxx11_._M_dataplus._M_p,
                            indent3_abi_cxx11_._M_string_length);
        local_520[0]._M_allocated_capacity._0_4_ = 0x4d495250;
        local_528 = (OSTEI_VRR_Algorithm_Base *)0x4;
        local_520[0]._M_local_buf[4] = '\0';
        local_530 = (undefined1  [8])local_520;
        ArrVarName((string *)local_500,tam_00,(string *)local_530);
        if (local_530 != (undefined1  [8])local_520) {
          operator_delete((void *)local_530);
        }
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_500._0_8_,local_500._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
        if ((QAM *)local_500._0_8_ != (QAM *)(local_500 + 0x10)) {
          operator_delete((void *)local_500._0_8_);
        }
        tam_00 = tam_00 + 1;
      } while (tam_00 != local_3d0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_3d0);
    pOVar4 = this->vrr_algo_;
    local_398 = local_568;
    sStack_390 = uStack_560;
    local_388._M_p = local_378;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,local_558._M_p,local_558._M_p + local_550);
    OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_((StringSet *)local_530,pOVar4,(QAM *)&local_398);
    if (local_388._M_p != local_378) {
      operator_delete(local_388._M_p);
    }
    uVar9 = local_520[0]._8_8_;
    if ((_Rb_tree_node_base *)local_520[0]._8_8_ != (_Rb_tree_node_base *)&local_528) {
      do {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,indent3_abi_cxx11_._M_dataplus._M_p,
                            indent3_abi_cxx11_._M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)(uVar9 + 0x20),
                            (long)((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9);
      } while ((_Rb_tree_node_base *)uVar9 != (_Rb_tree_node_base *)&local_528);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_530);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent3_abi_cxx11_._M_dataplus._M_p,indent3_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"num_n);",7);
    uVar9 = local_4c8._M_allocated_capacity;
    if ((_Rb_tree_node_base **)local_4c8._M_allocated_capacity == &local_4b8) goto LAB_0011d5cb;
  }
  operator_delete((void *)uVar9);
LAB_0011d5cb:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
  std::__cxx11::stringbuf::str();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3e8._16_8_,(char *)local_4d8._0_8_,local_4d8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\n\n",3);
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_558._M_p != local_548) {
    operator_delete(local_558._M_p);
  }
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRRFile(std::ostream & os, std::ostream & osh) const
{
    QAM am = info_.FinalAM();

    os << "//////////////////////////////////////////////\n";
    os << "// VRR: ( " << amchar[am[0]] << " " << amchar[am[1]] << " | " << amchar[am[2]] << " " << amchar[am[3]] << " )\n";
    os << "//////////////////////////////////////////////\n";

    RRStepType rrstep = vrr_algo_.GetRRStep(am);

    std::stringstream prototype;

    std::string stepchar = RRStepTypeToStr(rrstep);

    prototype << "void VRR_" << stepchar << "_"
              << amchar[am[0]] << "_" << amchar[am[1]] << "_"
              << amchar[am[2]] << "_" << amchar[am[3]]  << "(\n";

    // final target
    prototype << indent3 << "SIMINT_DBLTYPE * const restrict " << PrimVarName(am) << ",\n";

    for(const auto & it : vrr_algo_.GetAMReq(am))
        prototype << indent3 << "const SIMINT_DBLTYPE * const restrict " << PrimVarName(it) << ",\n";
    
    for(const auto & it : vrr_algo_.GetVarReq(am))
    {
        if(IsPointer(it))
            prototype << indent3 << "const SIMINT_DBLTYPE * " << it << ",\n";
        else
            prototype << indent3 << "const SIMINT_DBLTYPE " << it << ",\n";
    }

    prototype << indent3 << "const int num_n)";

    os << prototype.str() << "\n";
    os << "{\n";


    // is this in standard order, or one of the permutations?
    if(am[1] == 0 && am[3] == 0)
    {
        // standard ( X s | Y s )
        // Make this one

        os << "    int n = 0;\n";

        for(const auto & it : vrr_algo_.GetIntReq_2p(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2p);\n"; 

        for(const auto & it : vrr_algo_.GetIntReq_2q(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2q);\n"; 

        for(const auto & it : vrr_algo_.GetIntReq_2pq(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2pq);\n"; 

        // Write out the steps
        WriteVRRSteps_(os, am, vrr_algo_.GetSteps(am), "num_n");

    }
    else
    {
        // permutation. Call one of the others
        QAM tocall = am;
        if(am[0] == 0)
            std::swap(tocall[0], tocall[1]);
        if(am[2] == 0)
            std::swap(tocall[2], tocall[3]);

        if(rrstep == RRStepType::J)
            stepchar = 'I';
        else if(rrstep == RRStepType::L)
            stepchar = 'K';

        os << indent1 << "// Routines are identical except for swapping of\n";
        os << indent1 << "// PA with PB and QC with QD\n";
        os << "\n";
        os << indent1 << "VRR_" << stepchar << "_"
                      << amchar[tocall[0]] << "_" << amchar[tocall[1]] << "_"
                      << amchar[tocall[2]] << "_" << amchar[tocall[3]]  << "(\n";
    
        // final target
        os << indent3 << PrimVarName(am) << ",\n";
        
        for(const auto & it : vrr_algo_.GetAMReq(am))
            os << indent3 << PrimVarName(it) << ",\n";
    
        for(const auto & it : vrr_algo_.GetVarReq(am))
            os << indent3 << it << ",\n";

        os << indent3 << "num_n);";
    }

    os << "\n";
    os << "}\n";
    os << "\n\n";

    // header
    osh << prototype.str() << ";\n\n";
}